

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilist_node.h
# Opt level: O1

Instruction * __thiscall spvtools::opt::BasicBlock::GetMergeInst(BasicBlock *this)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  
  pIVar1 = (this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar1 != (Instruction *)0x0) &&
     ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    pIVar2 = (this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
    if (pIVar2 != pIVar1) {
      pIVar1 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      pIVar2 = (Instruction *)0x0;
      if ((pIVar1->opcode_ & ~OpUndef) == OpLoopMerge) {
        pIVar2 = pIVar1;
      }
      return pIVar2;
    }
    return (Instruction *)0x0;
  }
  __assert_fail("!insts_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                ,0x7e,"const_iterator spvtools::opt::BasicBlock::ctail() const");
}

Assistant:

inline NodeType* IntrusiveNodeBase<NodeType>::NextNode() const {
  if (!next_node_->is_sentinel_) return next_node_;
  return nullptr;
}